

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O3

basic_string_view<char,_std::char_traits<char>_> __thiscall
libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::substr
          (basic_string_view<char,_std::char_traits<char>_> *this,size_type __pos,size_type __n)

{
  ulong uVar1;
  out_of_range *this_00;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  
  uVar1 = this->__size - __pos;
  if (__pos <= this->__size) {
    if (uVar1 < __n) {
      __n = uVar1;
    }
    bVar2.__size = __n;
    bVar2.__data = this->__data + __pos;
    return bVar2;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"string_view::substr");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

constexpr inline
        size_type size()     const noexcept { return __size; }